

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

bool __thiscall QUrl::matches(QUrl *this,QUrl *url,FormattingOptions options)

{
  QUrlPrivate *pQVar1;
  QUrlPrivate *pQVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  pQVar2 = url->d;
  bVar7 = true;
  if (pQVar1 == (QUrlPrivate *)0x0 && pQVar2 == (QUrlPrivate *)0x0) goto LAB_0025fe7a;
  if (pQVar1 == (QUrlPrivate *)0x0) {
    bVar7 = false;
    if ((pQVar2->sectionIsPresent != '\0') || (pQVar2->port != -1)) goto LAB_0025fe7a;
    lVar3 = (pQVar2->path).d.size;
  }
  else {
    if (pQVar2 != (QUrlPrivate *)0x0) {
      cVar5 = ((pQVar1->flags & 1) == 0) * '\b';
      bVar8 = cVar5 - 9;
      if ((options.i & 1U) == 0) {
        lVar3 = (pQVar1->scheme).d.size;
        lVar4 = (pQVar2->scheme).d.size;
        if ((lVar3 == lVar4) &&
           (rhs.m_data = (pQVar2->scheme).d.ptr, rhs.m_size = lVar4,
           lhs.m_data = (pQVar1->scheme).d.ptr, lhs.m_size = lVar3,
           bVar6 = QtPrivate::equalStrings(lhs,rhs), bVar6)) goto LAB_0025fd26;
      }
      else {
        bVar8 = cVar5 - 10;
LAB_0025fd26:
        if ((options.i & 2U) == 0) {
          lVar3 = (pQVar1->password).d.size;
          lVar4 = (pQVar2->password).d.size;
          if ((lVar3 != lVar4) ||
             (rhs_00.m_data = (pQVar2->password).d.ptr, rhs_00.m_size = lVar4,
             lhs_00.m_data = (pQVar1->password).d.ptr, lhs_00.m_size = lVar3,
             bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00), !bVar6)) goto LAB_0025fe78;
        }
        else {
          bVar8 = bVar8 & 0xfb;
        }
        if ((~options.i & 6U) == 0) {
          bVar8 = bVar8 & 0xfd;
        }
        else {
          lVar3 = (pQVar1->userName).d.size;
          lVar4 = (pQVar2->userName).d.size;
          if ((lVar3 != lVar4) ||
             (rhs_01.m_data = (pQVar2->userName).d.ptr, rhs_01.m_size = lVar4,
             lhs_01.m_data = (pQVar1->userName).d.ptr, lhs_01.m_size = lVar3,
             bVar6 = QtPrivate::equalStrings(lhs_01,rhs_01), !bVar6)) goto LAB_0025fe78;
        }
        if ((options.i & 8U) == 0) {
          if (pQVar1->port != pQVar2->port) goto LAB_0025fe78;
        }
        else {
          bVar8 = bVar8 & 0xef;
        }
        if ((~options.i & 0x1eU) == 0) {
          bVar8 = bVar8 & 0xf7;
        }
        else {
          lVar3 = (pQVar1->host).d.size;
          lVar4 = (pQVar2->host).d.size;
          if ((lVar3 != lVar4) ||
             (rhs_03.m_data = (pQVar2->host).d.ptr, rhs_03.m_size = lVar4,
             lhs_03.m_data = (pQVar1->host).d.ptr, lhs_03.m_size = lVar3,
             bVar6 = QtPrivate::equalStrings(lhs_03,rhs_03), !bVar6)) goto LAB_0025fe78;
        }
        if ((options.i & 0x40U) == 0) {
          lVar3 = (pQVar1->query).d.size;
          lVar4 = (pQVar2->query).d.size;
          if ((lVar3 != lVar4) ||
             (rhs_02.m_data = (pQVar2->query).d.ptr, rhs_02.m_size = lVar4,
             lhs_02.m_data = (pQVar1->query).d.ptr, lhs_02.m_size = lVar3,
             bVar6 = QtPrivate::equalStrings(lhs_02,rhs_02), !bVar6)) goto LAB_0025fe78;
        }
        else {
          bVar8 = bVar8 & 0xbf;
        }
        if ((char)options.i < '\0') {
          bVar8 = bVar8 & 0x7f;
        }
        else {
          bVar6 = ::operator!=(&pQVar1->fragment,&pQVar2->fragment);
          if (bVar6) goto LAB_0025fe78;
        }
        if ((bVar8 & (url->d->sectionIsPresent ^ this->d->sectionIsPresent)) == 0) {
          if ((options.i & 0x20U) == 0) {
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (storage_type_conflict *)0x0;
            local_58.d.size = 0;
            QUrlPrivate::appendPath(this->d,&local_58,options,Path);
            local_78.d.d = (Data *)0x0;
            local_78.d.ptr = (storage_type_conflict *)0x0;
            local_78.d.size = 0;
            QUrlPrivate::appendPath(url->d,&local_78,options,Path);
            if (local_58.d.size == local_78.d.size) {
              rhs_04.m_data = local_78.d.ptr;
              rhs_04.m_size = local_78.d.size;
              lhs_04.m_data = local_58.d.ptr;
              lhs_04.m_size = local_58.d.size;
              bVar7 = QtPrivate::equalStrings(lhs_04,rhs_04);
            }
            else {
              bVar7 = false;
            }
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          goto LAB_0025fe7a;
        }
      }
LAB_0025fe78:
      bVar7 = false;
      goto LAB_0025fe7a;
    }
    bVar7 = false;
    if ((pQVar1->sectionIsPresent != '\0') || (pQVar1->port != -1)) goto LAB_0025fe7a;
    lVar3 = (pQVar1->path).d.size;
  }
  bVar7 = lVar3 == 0;
LAB_0025fe7a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QUrl::matches(const QUrl &url, FormattingOptions options) const
{
    if (!d && !url.d)
        return true;
    if (!d)
        return url.d->isEmpty();
    if (!url.d)
        return d->isEmpty();

    // First, compare which sections are present, since it speeds up the
    // processing considerably. We just have to ignore the host-is-present flag
    // for local files (the "file" protocol), due to the requirements of the
    // XDG file URI specification.
    int mask = QUrlPrivate::FullUrl;
    if (isLocalFile())
        mask &= ~QUrlPrivate::Host;

    if (options.testFlag(QUrl::RemoveScheme))
        mask &= ~QUrlPrivate::Scheme;
    else if (d->scheme != url.d->scheme)
        return false;

    if (options.testFlag(QUrl::RemovePassword))
        mask &= ~QUrlPrivate::Password;
    else if (d->password != url.d->password)
        return false;

    if (options.testFlag(QUrl::RemoveUserInfo))
        mask &= ~QUrlPrivate::UserName;
    else if (d->userName != url.d->userName)
        return false;

    if (options.testFlag(QUrl::RemovePort))
        mask &= ~QUrlPrivate::Port;
    else if (d->port != url.d->port)
        return false;

    if (options.testFlag(QUrl::RemoveAuthority))
        mask &= ~QUrlPrivate::Host;
    else if (d->host != url.d->host)
        return false;

    if (options.testFlag(QUrl::RemoveQuery))
        mask &= ~QUrlPrivate::Query;
    else if (d->query != url.d->query)
        return false;

    if (options.testFlag(QUrl::RemoveFragment))
        mask &= ~QUrlPrivate::Fragment;
    else if (d->fragment != url.d->fragment)
        return false;

    if ((d->sectionIsPresent & mask) != (url.d->sectionIsPresent & mask))
        return false;

    if (options.testFlag(QUrl::RemovePath))
        return true;

    // Compare paths, after applying path-related options
    QString path1;
    d->appendPath(path1, options, QUrlPrivate::Path);
    QString path2;
    url.d->appendPath(path2, options, QUrlPrivate::Path);
    return path1 == path2;
}